

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O3

Status * __thiscall
draco::StlEncoder::EncodeToFile
          (Status *__return_storage_ptr__,StlEncoder *this,Mesh *mesh,string *file_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Status *s;
  pointer *__ptr;
  ulong uVar3;
  EncoderBuffer buffer;
  undefined1 local_58 [8];
  undefined1 local_50 [16];
  char local_40 [8];
  _Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false> local_38;
  
  this->in_mesh_ = mesh;
  FileWriterFactory::OpenWriter((string *)local_58);
  if (local_58 == (undefined1  [8])0x0) {
    local_50._0_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"File couldn\'t be opened","");
    __return_storage_ptr__->code_ = IO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_50._0_8_,
               (char *)(local_50._0_8_ + local_50._8_8_));
    if ((char *)local_50._0_8_ == local_40) goto LAB_0011bf9e;
    uVar3 = (long)local_40 + 1;
  }
  else {
    EncoderBuffer::EncoderBuffer((EncoderBuffer *)local_50);
    this->in_mesh_ = mesh;
    this->out_buffer_ = (EncoderBuffer *)local_50;
    EncodeInternal(__return_storage_ptr__,this);
    this->out_buffer_ = (EncoderBuffer *)0x0;
    this->in_point_cloud_ = (PointCloud *)0x0;
    this->in_mesh_ = (Mesh *)0x0;
    if (__return_storage_ptr__->code_ == OK) {
      pcVar2 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
      paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      (**(code **)(*(long *)local_58 + 0x10))
                (local_58,local_50._0_8_,local_50._8_8_ - local_50._0_8_);
      __return_storage_ptr__->code_ = OK;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
      (__return_storage_ptr__->error_msg_)._M_string_length = 0;
      (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    }
    if ((_Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>)local_38._M_head_impl !=
        (_Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>)0x0) {
      operator_delete(local_38._M_head_impl,0x10);
    }
    local_38._M_head_impl = (BitEncoder *)0x0;
    if ((char *)local_50._0_8_ == (char *)0x0) goto LAB_0011bf9e;
    uVar3 = (long)local_40 - local_50._0_8_;
  }
  operator_delete((void *)local_50._0_8_,uVar3);
LAB_0011bf9e:
  if (local_58 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_58 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

Status StlEncoder::EncodeToFile(const Mesh &mesh,
                                const std::string &file_name) {
  in_mesh_ = &mesh;
  std::unique_ptr<FileWriterInterface> file =
      FileWriterFactory::OpenWriter(file_name);
  if (!file) {
    return Status(Status::IO_ERROR, "File couldn't be opened");
  }
  // Encode the mesh into a buffer.
  EncoderBuffer buffer;
  DRACO_RETURN_IF_ERROR(EncodeToBuffer(mesh, &buffer));
  // Write the buffer into the file.
  file->Write(buffer.data(), buffer.size());
  return OkStatus();
}